

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

RandomUniformDynamicLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::RandomUniformDynamicLayerParams>(Arena *arena)

{
  RandomUniformDynamicLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (RandomUniformDynamicLayerParams *)operator_new(0x28);
    CoreML::Specification::RandomUniformDynamicLayerParams::RandomUniformDynamicLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (RandomUniformDynamicLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::RandomUniformDynamicLayerParams::typeinfo
                     );
    CoreML::Specification::RandomUniformDynamicLayerParams::RandomUniformDynamicLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }